

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::predict<true,true>(gd *g,base_learner *param_2,example *ec)

{
  vw *all;
  float fVar1;
  trunc_data local_18;
  
  all = g->all;
  local_18.gravity = (float)all->sd->gravity;
  local_18.prediction = (ec->l).simple.initial;
  if ((all->weights).sparse == true) {
    foreach_feature<GD::trunc_data,_float_&,_&GD::vec_add_trunc,_sparse_parameters>
              (&(all->weights).sparse_weights,all->ignore_some_linear,all->ignore_linear,
               &all->interactions,all->permutations,&ec->super_example_predict,&local_18);
  }
  else {
    foreach_feature<GD::trunc_data,_float_&,_&GD::vec_add_trunc,_dense_parameters>
              (&(all->weights).dense_weights,all->ignore_some_linear,all->ignore_linear,
               &all->interactions,all->permutations,&ec->super_example_predict,&local_18);
  }
  ec->partial_prediction = local_18.prediction;
  fVar1 = (float)all->sd->contraction * local_18.prediction;
  ec->partial_prediction = fVar1;
  fVar1 = finalize_prediction(all->sd,fVar1);
  (ec->pred).scalar = fVar1;
  print_audit_features(all,ec);
  return;
}

Assistant:

void predict(gd& g, base_learner&, example& ec)
{
  vw& all = *g.all;
  if (l1)
    ec.partial_prediction = trunc_predict(all, ec, all.sd->gravity);
  else
    ec.partial_prediction = inline_predict(all, ec);

  ec.partial_prediction *= (float)all.sd->contraction;
  ec.pred.scalar = finalize_prediction(all.sd, ec.partial_prediction);
  if (audit)
    print_audit_features(all, ec);
}